

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

int is_alike_mv(int_mv candidate_mv,center_mv_t *center_mvs,int center_mvs_count,
               int skip_alike_starting_mv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  if (0 < center_mvs_count) {
    uVar1 = 0;
    do {
      iVar2 = (int)center_mvs[uVar1].mv.as_mv.col - ((int)candidate_mv.as_int >> 0x10);
      iVar3 = -iVar2;
      if (0 < iVar2) {
        iVar3 = iVar2;
      }
      if (iVar3 < *(int *)(&DAT_0051eea8 + (long)skip_alike_starting_mv * 4)) {
        iVar2 = (int)center_mvs[uVar1].mv.as_mv.row - (int)candidate_mv.as_mv.row;
        iVar3 = -iVar2;
        if (0 < iVar2) {
          iVar3 = iVar2;
        }
        if (iVar3 < *(int *)(&DAT_0051eea8 + (long)skip_alike_starting_mv * 4)) {
          return 1;
        }
      }
      uVar1 = uVar1 + 1;
    } while ((uint)center_mvs_count != uVar1);
  }
  return 0;
}

Assistant:

static int is_alike_mv(int_mv candidate_mv, center_mv_t *center_mvs,
                       int center_mvs_count, int skip_alike_starting_mv) {
  // MV difference threshold is in 1/8 precision.
  const int mv_diff_thr[3] = { 1, (8 << 3), (16 << 3) };
  int thr = mv_diff_thr[skip_alike_starting_mv];
  int i;

  for (i = 0; i < center_mvs_count; i++) {
    if (abs(center_mvs[i].mv.as_mv.col - candidate_mv.as_mv.col) < thr &&
        abs(center_mvs[i].mv.as_mv.row - candidate_mv.as_mv.row) < thr)
      return 1;
  }

  return 0;
}